

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_is_closing(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  uv_timer_t handle;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&handle);
  if (iVar1 == 0) {
    uv_close(&handle,0);
    iVar1 = uv_timer_start(&handle,never_cb,100);
    if (iVar1 == -0x16) {
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
      uVar2 = 0x12f;
    }
    else {
      pcVar3 = "UV_EINVAL == uv_timer_start(&handle, never_cb, 100, 100)";
      uVar2 = 0x12d;
    }
  }
  else {
    pcVar3 = "0 == uv_timer_init(uv_default_loop(), &handle)";
    uVar2 = 0x12a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(timer_is_closing) {
  uv_timer_t handle;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &handle));
  uv_close((uv_handle_t *)&handle, NULL);

  ASSERT(UV_EINVAL == uv_timer_start(&handle, never_cb, 100, 100));

  MAKE_VALGRIND_HAPPY();
  return 0;
}